

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O1

vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *
computeIntersections
          (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
           *__return_storage_ptr__,vector<Node,_std::allocator<Node>_> *nodes,
          vector<bool,_std::allocator<bool>_> *removed)

{
  _Bit_type *p_Var1;
  pointer pNVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pointer local_60;
  Node *local_58;
  ulong local_50;
  ulong local_48;
  vector<Node,_std::allocator<Node>_> *local_40;
  vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)
             __return_storage_ptr__;
  if ((nodes->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (nodes->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = 0;
    local_50 = 0x800000000000003f;
    local_40 = nodes;
    do {
      p_Var1 = (removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      local_48 = uVar6;
      if (((long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) *
          8 + (ulong)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
        if (uVar6 != 0) {
LAB_001015cb:
          lVar5 = 0;
          uVar7 = 0;
          do {
            p_Var1 = (removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if (((long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)p_Var1) * 8 +
                (ulong)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
LAB_00101626:
              pNVar2 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              bVar3 = quadtree::Box<float>::intersects
                                (&pNVar2[uVar6].box,
                                 (Box<float> *)((long)&(pNVar2->box).left + lVar5));
              if (bVar3) {
                pNVar2 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                local_60 = pNVar2 + uVar6;
                local_58 = (Node *)((long)&(pNVar2->box).left + lVar5);
                std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
                emplace_back<Node*,Node*>(local_38,&local_60,&local_58);
              }
            }
            else {
              uVar4 = uVar7 + 0x3f;
              if (-1 < (long)uVar7) {
                uVar4 = uVar7;
              }
              if ((p_Var1[((long)uVar4 >> 6) +
                          (ulong)((uVar7 & local_50) < 0x8000000000000001) + 0xffffffffffffffff] >>
                   (uVar7 & 0x3f) & 1) == 0) goto LAB_00101626;
            }
            uVar7 = uVar7 + 1;
            lVar5 = lVar5 + 0x18;
          } while (uVar6 + (uVar6 == 0) != uVar7);
        }
      }
      else {
        uVar7 = uVar6 + 0x3f;
        if (-1 < (long)uVar6) {
          uVar7 = uVar6;
        }
        if ((p_Var1[((long)uVar7 >> 6) +
                    (ulong)((uVar6 & local_50) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar6 & 0x3f) & 1) == 0 && uVar6 != 0) goto LAB_001015cb;
      }
      uVar6 = local_48 + 1;
    } while (uVar6 < (ulong)(((long)(local_40->super__Vector_base<Node,_std::allocator<Node>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_40->super__Vector_base<Node,_std::allocator<Node>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)local_38;
}

Assistant:

std::vector<std::pair<Node*, Node*>> computeIntersections(std::vector<Node>& nodes, const std::vector<bool>& removed)
{
    auto intersections = std::vector<std::pair<Node*, Node*>>();
    for (auto i = std::size_t(0); i < nodes.size(); ++i)
    {
        if (removed.size() == 0 || !removed[i])
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (removed.size() == 0 || !removed[j])
                {
                    if (nodes[i].box.intersects(nodes[j].box))
                        intersections.emplace_back(&nodes[i], &nodes[j]);
                }
            }
        }
    }
    return intersections;
}